

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O3

uint8_t * __thiscall
proto2_unittest::TestParsingMerge::_InternalSerialize
          (TestParsingMerge *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  int iVar2;
  TestAllTypes *pTVar3;
  ulong uVar4;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>_> *value;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestParsingMerge_RepeatedGroup>_>
  *value_00;
  uint8_t *puVar5;
  int iVar6;
  
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar1 & 1) != 0) {
    pTVar3 = (this->field_0)._impl_.required_all_types_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (1,(MessageLite *)pTVar3,(pTVar3->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  if ((uVar1 & 2) != 0) {
    pTVar3 = (this->field_0)._impl_.optional_all_types_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (2,(MessageLite *)pTVar3,(pTVar3->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  iVar2 = *(int *)((long)&this->field_0 + 0x28);
  if (iVar2 != 0) {
    iVar6 = 0;
    do {
      value = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>>
                        (&(this->field_0)._impl_.repeated_all_types_.super_RepeatedPtrFieldBase,
                         iVar6);
      target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                         (3,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                          stream);
      iVar6 = iVar6 + 1;
    } while (iVar2 != iVar6);
  }
  if ((uVar1 & 4) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    target = google::protobuf::internal::WireFormatLite::InternalWriteGroup
                       (10,(MessageLite *)(this->field_0)._impl_.optionalgroup_,target,stream);
  }
  iVar2 = *(int *)((long)&this->field_0 + 0x40);
  if (iVar2 != 0) {
    iVar6 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestParsingMerge_RepeatedGroup>>
                           (&(this->field_0)._impl_.repeatedgroup_.super_RepeatedPtrFieldBase,iVar6)
      ;
      target = google::protobuf::internal::WireFormatLite::InternalWriteGroup
                         (0x14,(MessageLite *)value_00,target,stream);
      iVar6 = iVar6 + 1;
    } while (iVar2 != iVar6);
  }
  if (*(short *)((long)&this->field_0 + 10) != 0) {
    target = google::protobuf::internal::ExtensionSet::_InternalSerializeAllImpl
                       (&(this->field_0)._impl_._extensions_,
                        (MessageLite *)_TestParsingMerge_default_instance_,target,stream);
  }
  uVar4 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar4 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar5;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestParsingMerge::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestParsingMerge& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestParsingMerge)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .proto2_unittest.TestAllTypes required_all_types = 1 [features = {
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        1, *this_._impl_.required_all_types_, this_._impl_.required_all_types_->GetCachedSize(), target,
        stream);
  }

  // .proto2_unittest.TestAllTypes optional_all_types = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        2, *this_._impl_.optional_all_types_, this_._impl_.optional_all_types_->GetCachedSize(), target,
        stream);
  }

  // repeated .proto2_unittest.TestAllTypes repeated_all_types = 3;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_repeated_all_types_size());
       i < n; i++) {
    const auto& repfield = this_._internal_repeated_all_types().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            3, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // .proto2_unittest.TestParsingMerge.OptionalGroup optionalgroup = 10 [features = {
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
        10, *this_._impl_.optionalgroup_, target, stream);
  }

  // repeated .proto2_unittest.TestParsingMerge.RepeatedGroup repeatedgroup = 20 [features = {
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_repeatedgroup_size());
       i < n; i++) {
    target = stream->EnsureSpace(target);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
            20, this_._internal_repeatedgroup().Get(i),
            target, stream);
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestParsingMerge)
  return target;
}